

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_b0093a::TGlslangToSpvTraverser::visitLoop
          (TGlslangToSpvTraverser *this,TVisit param_1,TIntermLoop *node)

{
  Block *thenBlock;
  Block *mergeBlock;
  Block *continueBlock;
  bool bVar1;
  int iVar2;
  int iVar3;
  Id condition_00;
  LoopBlocks *pLVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  TIntermNode *pTVar6;
  TIntermTyped *pTVar7;
  undefined4 extraout_var_04;
  value_type local_6e;
  value_type local_6d;
  Id condition_1;
  Block *pBStack_68;
  Id condition;
  Block *test;
  undefined1 local_58 [4];
  LoopControlMask control;
  vector<unsigned_int,_std::allocator<unsigned_int>_> operands;
  LoopBlocks blocks;
  TIntermLoop *node_local;
  TVisit param_1_local;
  TGlslangToSpvTraverser *this_local;
  
  pLVar4 = spv::Builder::makeNewLoop(&this->builder);
  operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pLVar4->head;
  thenBlock = pLVar4->body;
  mergeBlock = pLVar4->merge;
  continueBlock = pLVar4->continue_target;
  spv::Builder::createBranch
            (&this->builder,true,
             (Block *)operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  test._4_4_ = TranslateLoopControl
                         (this,node,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58)
  ;
  spv::Builder::setBuildPoint
            (&this->builder,
             (Block *)operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  iVar2 = (**(node->super_TIntermNode)._vptr_TIntermNode)();
  iVar2 = *(int *)(CONCAT44(extraout_var,iVar2) + 0xc);
  iVar3 = (**(node->super_TIntermNode)._vptr_TIntermNode)();
  pcVar5 = glslang::TSourceLoc::getFilename((TSourceLoc *)CONCAT44(extraout_var_00,iVar3));
  spv::Builder::setDebugSourceLocation(&this->builder,iVar2,pcVar5);
  spv::Builder::createLoopMerge
            (&this->builder,mergeBlock,continueBlock,test._4_4_,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  bVar1 = glslang::TIntermLoop::testFirst(node);
  if ((bVar1) && (pTVar7 = glslang::TIntermLoop::getTest(node), pTVar7 != (TIntermTyped *)0x0)) {
    pBStack_68 = spv::Builder::makeNewBlock(&this->builder);
    spv::Builder::createBranch(&this->builder,true,pBStack_68);
    spv::Builder::setBuildPoint(&this->builder,pBStack_68);
    pTVar7 = glslang::TIntermLoop::getTest(node);
    (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[2])(pTVar7,this);
    pTVar7 = glslang::TIntermLoop::getTest(node);
    iVar2 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    condition_1 = accessChainLoad(this,(TType *)CONCAT44(extraout_var_01,iVar2));
    spv::Builder::createConditionalBranch(&this->builder,condition_1,thenBlock,mergeBlock);
    spv::Builder::setBuildPoint(&this->builder,thenBlock);
    local_6d = true;
    std::stack<bool,_std::deque<bool,_std::allocator<bool>_>_>::push(&this->breakForLoop,&local_6d);
    pTVar6 = glslang::TIntermLoop::getBody(node);
    if (pTVar6 != (TIntermNode *)0x0) {
      pTVar6 = glslang::TIntermLoop::getBody(node);
      (*pTVar6->_vptr_TIntermNode[2])(pTVar6,this);
    }
    spv::Builder::createBranch(&this->builder,true,continueBlock);
    std::stack<bool,_std::deque<bool,_std::allocator<bool>_>_>::pop(&this->breakForLoop);
    spv::Builder::setBuildPoint(&this->builder,continueBlock);
    pTVar7 = glslang::TIntermLoop::getTerminal(node);
    if (pTVar7 != (TIntermTyped *)0x0) {
      pTVar7 = glslang::TIntermLoop::getTerminal(node);
      (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[2])(pTVar7,this);
    }
    spv::Builder::createBranch
              (&this->builder,true,
               (Block *)operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    iVar2 = (**(node->super_TIntermNode)._vptr_TIntermNode)();
    iVar2 = *(int *)(CONCAT44(extraout_var_02,iVar2) + 0xc);
    iVar3 = (**(node->super_TIntermNode)._vptr_TIntermNode)();
    pcVar5 = glslang::TSourceLoc::getFilename((TSourceLoc *)CONCAT44(extraout_var_03,iVar3));
    spv::Builder::setDebugSourceLocation(&this->builder,iVar2,pcVar5);
    spv::Builder::createBranch(&this->builder,true,thenBlock);
    local_6e = true;
    std::stack<bool,_std::deque<bool,_std::allocator<bool>_>_>::push(&this->breakForLoop,&local_6e);
    spv::Builder::setBuildPoint(&this->builder,thenBlock);
    pTVar6 = glslang::TIntermLoop::getBody(node);
    if (pTVar6 != (TIntermNode *)0x0) {
      pTVar6 = glslang::TIntermLoop::getBody(node);
      (*pTVar6->_vptr_TIntermNode[2])(pTVar6,this);
    }
    spv::Builder::createBranch(&this->builder,true,continueBlock);
    std::stack<bool,_std::deque<bool,_std::allocator<bool>_>_>::pop(&this->breakForLoop);
    spv::Builder::setBuildPoint(&this->builder,continueBlock);
    pTVar7 = glslang::TIntermLoop::getTerminal(node);
    if (pTVar7 != (TIntermTyped *)0x0) {
      pTVar7 = glslang::TIntermLoop::getTerminal(node);
      (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[2])(pTVar7,this);
    }
    pTVar7 = glslang::TIntermLoop::getTest(node);
    if (pTVar7 == (TIntermTyped *)0x0) {
      spv::Builder::createBranch
                (&this->builder,true,
                 (Block *)operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    else {
      pTVar7 = glslang::TIntermLoop::getTest(node);
      (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[2])(pTVar7,this);
      pTVar7 = glslang::TIntermLoop::getTest(node);
      iVar2 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[0x1e])();
      condition_00 = accessChainLoad(this,(TType *)CONCAT44(extraout_var_04,iVar2));
      spv::Builder::createConditionalBranch
                (&this->builder,condition_00,
                 (Block *)operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,mergeBlock);
    }
  }
  spv::Builder::setBuildPoint(&this->builder,mergeBlock);
  spv::Builder::closeLoop(&this->builder);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  return false;
}

Assistant:

bool TGlslangToSpvTraverser::visitLoop(glslang::TVisit /* visit */, glslang::TIntermLoop* node)
{
    auto blocks = builder.makeNewLoop();
    builder.createBranch(true, &blocks.head);

    // Loop control:
    std::vector<unsigned int> operands;
    const spv::LoopControlMask control = TranslateLoopControl(*node, operands);

    // Spec requires back edges to target header blocks, and every header block
    // must dominate its merge block.  Make a header block first to ensure these
    // conditions are met.  By definition, it will contain OpLoopMerge, followed
    // by a block-ending branch.  But we don't want to put any other body/test
    // instructions in it, since the body/test may have arbitrary instructions,
    // including merges of its own.
    builder.setBuildPoint(&blocks.head);
    builder.setDebugSourceLocation(node->getLoc().line, node->getLoc().getFilename());
    builder.createLoopMerge(&blocks.merge, &blocks.continue_target, control, operands);
    if (node->testFirst() && node->getTest()) {
        spv::Block& test = builder.makeNewBlock();
        builder.createBranch(true, &test);

        builder.setBuildPoint(&test);
        node->getTest()->traverse(this);
        spv::Id condition = accessChainLoad(node->getTest()->getType());
        builder.createConditionalBranch(condition, &blocks.body, &blocks.merge);

        builder.setBuildPoint(&blocks.body);
        breakForLoop.push(true);
        if (node->getBody())
            node->getBody()->traverse(this);
        builder.createBranch(true, &blocks.continue_target);
        breakForLoop.pop();

        builder.setBuildPoint(&blocks.continue_target);
        if (node->getTerminal())
            node->getTerminal()->traverse(this);
        builder.createBranch(true, &blocks.head);
    } else {
        builder.setDebugSourceLocation(node->getLoc().line, node->getLoc().getFilename());
        builder.createBranch(true, &blocks.body);

        breakForLoop.push(true);
        builder.setBuildPoint(&blocks.body);
        if (node->getBody())
            node->getBody()->traverse(this);
        builder.createBranch(true, &blocks.continue_target);
        breakForLoop.pop();

        builder.setBuildPoint(&blocks.continue_target);
        if (node->getTerminal())
            node->getTerminal()->traverse(this);
        if (node->getTest()) {
            node->getTest()->traverse(this);
            spv::Id condition =
                accessChainLoad(node->getTest()->getType());
            builder.createConditionalBranch(condition, &blocks.head, &blocks.merge);
        } else {
            // TODO: unless there was a break/return/discard instruction
            // somewhere in the body, this is an infinite loop, so we should
            // issue a warning.
            builder.createBranch(true, &blocks.head);
        }
    }
    builder.setBuildPoint(&blocks.merge);
    builder.closeLoop();
    return false;
}